

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O3

Top_dimensional_cells_iterator * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::Top_dimensional_cells_iterator::
operator++(Top_dimensional_cells_iterator *__return_storage_ptr__,
          Top_dimensional_cells_iterator *this)

{
  pointer __s;
  pointer puVar1;
  ulong uVar2;
  size_t __n;
  
  __s = (this->counter).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (this->b->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (ulong)((long)(this->b->sizes).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1) >> 2 & 0xffffffff;
  if (uVar2 != 0) {
    __n = 0;
    do {
      if (*(ulong *)((long)__s + __n) != (ulong)(*puVar1 - 1)) {
        *(ulong *)((long)__s + __n) = *(ulong *)((long)__s + __n) + 1;
        if (__n != 0) {
          memset(__s,0,__n);
        }
        goto LAB_001053d2;
      }
      __n = __n + 8;
      puVar1 = puVar1 + 1;
    } while (uVar2 * 8 != __n);
  }
  *__s = *__s + 1;
LAB_001053d2:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->counter,&this->counter);
  __return_storage_ptr__->b = this->b;
  return __return_storage_ptr__;
}

Assistant:

Top_dimensional_cells_iterator operator++() {
      // first find first element of the counter that can be increased:
      std::size_t dim = 0;
      while ((dim != this->b->dimension()) && (this->counter[dim] == this->b->sizes[dim] - 1)) ++dim;

      if (dim != this->b->dimension()) {
        ++this->counter[dim];
        for (std::size_t i = 0; i != dim; ++i) {
          this->counter[i] = 0;
        }
      } else {
        ++this->counter[0];
      }
      return *this;
    }